

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O2

void variance4_sse2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int h,__m128i *sse,
                   __m128i *sum)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  int iVar20;
  int iVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  undefined1 auVar28 [15];
  unkuint9 Var29;
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  unkuint9 Var32;
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  longlong lVar36;
  int i;
  int iVar37;
  undefined1 auVar38 [16];
  ulong uVar39;
  undefined1 auVar40 [16];
  
  *sum = (__m128i)0x0;
  for (iVar37 = 0; iVar37 < h; iVar37 = iVar37 + 2) {
    uVar1 = *(undefined4 *)(src + src_stride);
    uVar2 = *(undefined4 *)src;
    uVar39 = CONCAT44(uVar1,uVar2);
    auVar4._8_6_ = 0;
    auVar4._0_8_ = uVar39;
    auVar4[0xe] = (char)((uint)uVar1 >> 0x18);
    auVar6._8_4_ = 0;
    auVar6._0_8_ = uVar39;
    auVar6[0xc] = (char)((uint)uVar1 >> 0x10);
    auVar6._13_2_ = auVar4._13_2_;
    auVar8._8_4_ = 0;
    auVar8._0_8_ = uVar39;
    auVar8._12_3_ = auVar6._12_3_;
    auVar10._8_2_ = 0;
    auVar10._0_8_ = uVar39;
    auVar10[10] = (char)((uint)uVar1 >> 8);
    auVar10._11_4_ = auVar8._11_4_;
    auVar12._8_2_ = 0;
    auVar12._0_8_ = uVar39;
    auVar12._10_5_ = auVar10._10_5_;
    auVar14[8] = (char)uVar1;
    auVar14._0_8_ = uVar39;
    auVar14._9_6_ = auVar12._9_6_;
    auVar28._7_8_ = 0;
    auVar28._0_7_ = auVar14._8_7_;
    Var29 = CONCAT81(SUB158(auVar28 << 0x40,7),(char)((uint)uVar2 >> 0x18));
    auVar34._9_6_ = 0;
    auVar34._0_9_ = Var29;
    auVar16[4] = (char)((uint)uVar2 >> 0x10);
    auVar16._0_4_ = uVar2;
    auVar16._5_10_ = SUB1510(auVar34 << 0x30,5);
    auVar30._11_4_ = 0;
    auVar30._0_11_ = auVar16._4_11_;
    auVar18[2] = (char)((uint)uVar2 >> 8);
    auVar18._0_2_ = (ushort)uVar2;
    auVar18._3_12_ = SUB1512(auVar30 << 0x20,3);
    uVar1 = *(undefined4 *)(ref + ref_stride);
    uVar3 = *(undefined4 *)ref;
    uVar39 = CONCAT44(uVar1,uVar3);
    auVar5._8_6_ = 0;
    auVar5._0_8_ = uVar39;
    auVar5[0xe] = (char)((uint)uVar1 >> 0x18);
    auVar7._8_4_ = 0;
    auVar7._0_8_ = uVar39;
    auVar7[0xc] = (char)((uint)uVar1 >> 0x10);
    auVar7._13_2_ = auVar5._13_2_;
    auVar9._8_4_ = 0;
    auVar9._0_8_ = uVar39;
    auVar9._12_3_ = auVar7._12_3_;
    auVar11._8_2_ = 0;
    auVar11._0_8_ = uVar39;
    auVar11[10] = (char)((uint)uVar1 >> 8);
    auVar11._11_4_ = auVar9._11_4_;
    auVar13._8_2_ = 0;
    auVar13._0_8_ = uVar39;
    auVar13._10_5_ = auVar11._10_5_;
    auVar15[8] = (char)uVar1;
    auVar15._0_8_ = uVar39;
    auVar15._9_6_ = auVar13._9_6_;
    auVar31._7_8_ = 0;
    auVar31._0_7_ = auVar15._8_7_;
    Var32 = CONCAT81(SUB158(auVar31 << 0x40,7),(char)((uint)uVar3 >> 0x18));
    auVar35._9_6_ = 0;
    auVar35._0_9_ = Var32;
    auVar17[4] = (char)((uint)uVar3 >> 0x10);
    auVar17._0_4_ = uVar3;
    auVar17._5_10_ = SUB1510(auVar35 << 0x30,5);
    auVar33._11_4_ = 0;
    auVar33._0_11_ = auVar17._4_11_;
    auVar19[2] = (char)((uint)uVar3 >> 8);
    auVar19._0_2_ = (ushort)uVar3;
    auVar19._3_12_ = SUB1512(auVar33 << 0x20,3);
    auVar40._0_2_ = ((ushort)uVar2 & 0xff) - ((ushort)uVar3 & 0xff);
    auVar40._2_2_ = auVar18._2_2_ - auVar19._2_2_;
    auVar40._4_2_ = auVar16._4_2_ - auVar17._4_2_;
    auVar40._6_2_ = (short)Var29 - (short)Var32;
    auVar40._8_2_ = auVar14._8_2_ - auVar15._8_2_;
    auVar40._10_2_ = auVar10._10_2_ - auVar11._10_2_;
    auVar40._12_2_ = auVar6._12_2_ - auVar7._12_2_;
    auVar40._14_2_ = (auVar4._13_2_ >> 8) - (auVar5._13_2_ >> 8);
    auVar38 = pmaddwd(auVar40,auVar40);
    iVar20 = *(int *)((long)*sse + 4);
    lVar36 = (*sse)[1];
    iVar21 = *(int *)((long)*sse + 0xc);
    *(int *)*sse = auVar38._0_4_ + (int)(*sse)[0];
    *(int *)((long)*sse + 4) = auVar38._4_4_ + iVar20;
    *(int *)(*sse + 1) = auVar38._8_4_ + (int)lVar36;
    *(int *)((long)*sse + 0xc) = auVar38._12_4_ + iVar21;
    sVar22 = *(short *)((long)*sum + 2);
    sVar23 = *(short *)((long)*sum + 4);
    sVar24 = *(short *)((long)*sum + 6);
    lVar36 = (*sum)[1];
    sVar25 = *(short *)((long)*sum + 10);
    sVar26 = *(short *)((long)*sum + 0xc);
    sVar27 = *(short *)((long)*sum + 0xe);
    *(short *)*sum = auVar40._0_2_ + (short)(*sum)[0];
    *(short *)((long)*sum + 2) = auVar40._2_2_ + sVar22;
    *(short *)((long)*sum + 4) = auVar40._4_2_ + sVar23;
    *(short *)((long)*sum + 6) = auVar40._6_2_ + sVar24;
    *(short *)(*sum + 1) = auVar40._8_2_ + (short)lVar36;
    *(short *)((long)*sum + 10) = auVar40._10_2_ + sVar25;
    *(short *)((long)*sum + 0xc) = auVar40._12_2_ + sVar26;
    *(short *)((long)*sum + 0xe) = auVar40._14_2_ + sVar27;
    src = src + src_stride * 2;
    ref = ref + ref_stride * 2;
  }
  return;
}

Assistant:

static inline void variance4_sse2(const uint8_t *src, const int src_stride,
                                  const uint8_t *ref, const int ref_stride,
                                  const int h, __m128i *const sse,
                                  __m128i *const sum) {
  assert(h <= 256);  // May overflow for larger height.
  *sum = _mm_setzero_si128();

  for (int i = 0; i < h; i += 2) {
    const __m128i s = load4x2_sse2(src, src_stride);
    const __m128i r = load4x2_sse2(ref, ref_stride);

    variance_kernel_sse2(s, r, sse, sum);
    src += 2 * src_stride;
    ref += 2 * ref_stride;
  }
}